

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

IRet * __thiscall
deqp::gls::BuiltinPrecisionTests::
DerivedFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
::doApply(IRet *__return_storage_ptr__,
         DerivedFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
         *this,EvalContext *ctx,IArgs *args)

{
  pointer pSVar1;
  long *plVar2;
  Expr<float> *pEVar3;
  Vector<tcu::Interval,_2> *pVVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  bool bVar8;
  undefined7 uVar9;
  bool bVar10;
  undefined7 uVar11;
  IVal *pIVar12;
  size_t ndx;
  ulong uVar13;
  long lVar14;
  Environment funEnv;
  EvalContext funCtx;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_c0;
  undefined8 local_90;
  double dStack_88;
  double local_80;
  int local_78;
  int iStack_74;
  int iStack_70;
  YesNoMaybe YStack_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  double local_58;
  Precision local_50;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_48;
  int local_40;
  
  local_c0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c0._M_impl.super__Rb_tree_header._M_header;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  __return_storage_ptr__->m_hasNaN = false;
  __return_storage_ptr__->m_lo = INFINITY;
  __return_storage_ptr__->m_hi = -INFINITY;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
  initialize(this);
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_c0,
             (this->m_var0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             .m_ptr,args->a);
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_c0,
             (this->m_var1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             .m_ptr,args->b);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_c0,
             (this->m_var2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,args->c);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_c0,
             (this->m_var3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,args->d);
  local_50 = ctx->floatPrecision;
  local_40 = ctx->callDepth;
  local_58 = (ctx->format).m_maxValue;
  local_78 = (ctx->format).m_minExp;
  iStack_74 = (ctx->format).m_maxExp;
  iStack_70 = (ctx->format).m_fractionBits;
  YStack_6c = (ctx->format).m_hasSubnormal;
  local_68._0_4_ = (ctx->format).m_hasInf;
  local_68._4_4_ = (ctx->format).m_hasNaN;
  uStack_60 = *(undefined8 *)&(ctx->format).m_exactPrecision;
  lVar14 = 0;
  uVar13 = 0;
  local_48 = &local_c0;
  while( true ) {
    pSVar1 = (this->m_body).
             super__Vector_base<deqp::gls::BuiltinPrecisionTests::StatementP,_std::allocator<deqp::gls::BuiltinPrecisionTests::StatementP>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->m_body).
                      super__Vector_base<deqp::gls::BuiltinPrecisionTests::StatementP,_std::allocator<deqp::gls::BuiltinPrecisionTests::StatementP>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 >> 4) <= uVar13)
    break;
    plVar2 = *(long **)((long)&(pSVar1->
                               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Statement>).
                               m_ptr + lVar14);
    (**(code **)(*plVar2 + 0x18))(plVar2,&local_78);
    uVar13 = uVar13 + 1;
    lVar14 = lVar14 + 0x10;
  }
  pEVar3 = (this->m_ret).super_ExprPBase<float>.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_ptr;
  (*(pEVar3->super_ExprBase)._vptr_ExprBase[4])(&local_90,pEVar3,&local_78);
  __return_storage_ptr__->m_hi = local_80;
  *(undefined8 *)__return_storage_ptr__ = local_90;
  __return_storage_ptr__->m_lo = dStack_88;
  pIVar12 = Environment::lookup<tcu::Vector<float,2>>
                      ((Environment *)&local_c0,
                       (this->m_var0).
                       super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                       .m_ptr);
  pVVar4 = args->a;
  bVar10 = pIVar12->m_data[0].m_hasNaN;
  uVar11 = *(undefined7 *)&pIVar12->m_data[0].field_0x1;
  dVar5 = pIVar12->m_data[0].m_lo;
  dVar6 = pIVar12->m_data[0].m_hi;
  bVar8 = pIVar12->m_data[1].m_hasNaN;
  uVar9 = *(undefined7 *)&pIVar12->m_data[1].field_0x1;
  dVar7 = pIVar12->m_data[1].m_hi;
  pVVar4->m_data[1].m_lo = pIVar12->m_data[1].m_lo;
  pVVar4->m_data[1].m_hi = dVar7;
  pVVar4->m_data[0].m_hi = dVar6;
  pVVar4->m_data[1].m_hasNaN = bVar8;
  *(undefined7 *)&pVVar4->m_data[1].field_0x1 = uVar9;
  pVVar4->m_data[0].m_hasNaN = bVar10;
  *(undefined7 *)&pVVar4->m_data[0].field_0x1 = uVar11;
  pVVar4->m_data[0].m_lo = dVar5;
  pIVar12 = Environment::lookup<tcu::Vector<float,2>>
                      ((Environment *)&local_c0,
                       (this->m_var1).
                       super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                       .m_ptr);
  pVVar4 = args->b;
  bVar10 = pIVar12->m_data[0].m_hasNaN;
  uVar11 = *(undefined7 *)&pIVar12->m_data[0].field_0x1;
  dVar5 = pIVar12->m_data[0].m_lo;
  dVar6 = pIVar12->m_data[0].m_hi;
  bVar8 = pIVar12->m_data[1].m_hasNaN;
  uVar9 = *(undefined7 *)&pIVar12->m_data[1].field_0x1;
  dVar7 = pIVar12->m_data[1].m_hi;
  pVVar4->m_data[1].m_lo = pIVar12->m_data[1].m_lo;
  pVVar4->m_data[1].m_hi = dVar7;
  pVVar4->m_data[0].m_hi = dVar6;
  pVVar4->m_data[1].m_hasNaN = bVar8;
  *(undefined7 *)&pVVar4->m_data[1].field_0x1 = uVar9;
  pVVar4->m_data[0].m_hasNaN = bVar10;
  *(undefined7 *)&pVVar4->m_data[0].field_0x1 = uVar11;
  pVVar4->m_data[0].m_lo = dVar5;
  Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_c0,
             (this->m_var2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr);
  Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_c0,
             (this->m_var3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_c0);
  return __return_storage_ptr__;
}

Assistant:

IRet						doApply			(const EvalContext&	ctx,
												 const IArgs&		args) const
	{
		Environment	funEnv;
		IArgs&		mutArgs		= const_cast<IArgs&>(args);
		IRet		ret;

		initialize();

		funEnv.bind(*m_var0, args.a);
		funEnv.bind(*m_var1, args.b);
		funEnv.bind(*m_var2, args.c);
		funEnv.bind(*m_var3, args.d);

		{
			EvalContext	funCtx(ctx.format, ctx.floatPrecision, funEnv, ctx.callDepth);

			for (size_t ndx = 0; ndx < m_body.size(); ++ndx)
				m_body[ndx]->execute(funCtx);

			ret = m_ret->evaluate(funCtx);
		}

		// \todo [lauri] Store references instead of values in environment
		const_cast<IArg0&>(mutArgs.a) = funEnv.lookup(*m_var0);
		const_cast<IArg1&>(mutArgs.b) = funEnv.lookup(*m_var1);
		const_cast<IArg2&>(mutArgs.c) = funEnv.lookup(*m_var2);
		const_cast<IArg3&>(mutArgs.d) = funEnv.lookup(*m_var3);

		return ret;
	}